

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O2

void __thiscall
Variable_addVariableDuplicates_Test::~Variable_addVariableDuplicates_Test
          (Variable_addVariableDuplicates_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Variable, addVariableDuplicates)
{
    auto model = libcellml::Model::create("model");
    auto tomato = libcellml::Component::create("tomato");
    auto apple = libcellml::Component::create("apple");
    auto pip = libcellml::Variable::create("pip");

    EXPECT_TRUE(model->addComponent(tomato));
    EXPECT_TRUE(model->addComponent(apple));

    // Adding a pip to the tomato.
    EXPECT_TRUE(tomato->addVariable(pip));
    EXPECT_EQ(size_t(1), tomato->variableCount());

    // Add the same pip again.
    EXPECT_TRUE(tomato->addVariable(pip));
    EXPECT_EQ(size_t(2), tomato->variableCount());

    // Add the same pip to the apple this time, which will effectively move it
    // from the tomato to the apple. Leaving one pip in the tomato.
    EXPECT_TRUE(apple->addVariable(pip));

    EXPECT_EQ(size_t(1), apple->variableCount());
    EXPECT_EQ(size_t(1), tomato->variableCount());
}